

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int yylex_NORMAL(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  Symbol *sym_00;
  char *str;
  char *s;
  Symbol *sym;
  int tokenType;
  uint32_t n;
  int c;
  
LAB_00110458:
  do {
    iVar2 = nextChar();
    switch(iVar2) {
    default:
      goto switchD_00110486_caseD_0;
    case 10:
      return 0xd;
    case 0xd:
      handleCRLF(iVar2);
      return 0xd;
    case 0x21:
      iVar2 = peek();
      if (iVar2 != 0x3d) {
        return 0xe;
      }
      shiftChar();
      return 0x15;
    case 0x22:
      readString(false);
      return 4;
    case 0x23:
      iVar3 = peek();
      if (iVar3 == 0x22) {
        shiftChar();
        readString(true);
        return 4;
      }
switchD_00110486_caseD_0:
      bVar1 = startsIdentifier(iVar2);
      if (bVar1) {
        iVar2 = readIdentifier((char)iVar2);
        if ((((iVar2 == 0x5e) && (lexerState->lastToken == 0xd)) &&
            (uVar4 = lexer_GetIFDepth(), uVar4 != 0)) &&
           ((bVar1 = lexer_RanIFBlock(), bVar1 && (bVar1 = lexer_ReachedELSEBlock(), !bVar1)))) {
          iVar2 = yylex_SKIP_TO_ENDC();
          return iVar2;
        }
        if ((iVar2 != 0x4a) && (iVar2 != 0x4b)) {
          return iVar2;
        }
        if ((((iVar2 != 0x4a) || ((lexerState->expandStrings & 1U) == 0)) ||
            (sym_00 = sym_FindExactSymbol(yylval.symName), sym_00 == (Symbol *)0x0)) ||
           (sym_00->type != SYM_EQUS)) {
          if (iVar2 != 0x4a) {
            return iVar2;
          }
          if (((lexerState->atLineStart & 1U) == 0) && (iVar2 = peek(), iVar2 != 0x3a)) {
            return 0x4a;
          }
          return 0x49;
        }
        str = sym_GetStringValue(sym_00);
        if (str == (char *)0x0) {
          __assert_fail("s",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                        ,0x7fe,"yylex_NORMAL");
        }
        if (*str != '\0') {
          beginExpansion(str,false,sym_00->name);
        }
        goto LAB_00110458;
      }
      if ((lexerState->capturing & 1U) == 0) {
        printChar(iVar2);
        error("Unknown character %s\n");
      }
      break;
    case 0x24:
      yylval.sectSpec.bank = readHexNumber();
      return 3;
    case 0x25:
      iVar2 = peek();
      if (iVar2 == 0x3d) {
        shiftChar();
        return 0x54;
      }
      if ((iVar2 != binDigits[0]) && (iVar2 != binDigits[1])) {
        return 0x21;
      }
      yylval.sectSpec.bank = readBinaryNumber();
      return 3;
    case 0x26:
      iVar2 = peek();
      if (iVar2 == 0x3d) {
        shiftChar();
        return 0x57;
      }
      if (iVar2 != 0x26) {
        if ((0x2f < iVar2) && (iVar2 < 0x38)) {
          yylval.sectSpec.bank = readNumber(8,0);
          return 3;
        }
        return 0x1b;
      }
      shiftChar();
      return 0xf;
    case 0x28:
      return 0xb;
    case 0x29:
      return 0xc;
    case 0x2a:
      iVar2 = peek();
      if (iVar2 == 0x2a) {
        shiftChar();
        return 0x24;
      }
      if (iVar2 != 0x3d) {
        return 0x1f;
      }
      shiftChar();
      return 0x52;
    case 0x2b:
      iVar2 = peek();
      if (iVar2 != 0x3d) {
        return 0x17;
      }
      shiftChar();
      return 0x50;
    case 0x2c:
      return 6;
    case 0x2d:
      iVar2 = peek();
      if (iVar2 != 0x3d) {
        return 0x18;
      }
      shiftChar();
      return 0x51;
    case 0x2f:
      iVar2 = peek();
      if (iVar2 != 0x2a) {
        if (iVar2 != 0x3d) {
          return 0x20;
        }
        shiftChar();
        return 0x53;
      }
      shiftChar();
      discardBlockComment();
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      sym._4_4_ = readNumber(10,iVar2 - 0x30);
      iVar2 = peek();
      if (iVar2 == 0x2e) {
        shiftChar();
        sym._4_4_ = readFractionalPart(sym._4_4_);
      }
      yylval.expr.val = sym._4_4_;
      return 3;
    case 0x3a:
      iVar2 = peek();
      if ((iVar2 != 0x2b) && (iVar2 != 0x2d)) {
        if (iVar2 != 0x3a) {
          return 7;
        }
        shiftChar();
        return 8;
      }
      readAnonLabelRef((char)iVar2);
      return 0x4c;
    case 0x3b:
      discardComment();
    case 9:
    case 0x20:
      break;
    case 0x3c:
      iVar2 = peek();
      if (iVar2 == 0x3c) {
        shiftChar();
        iVar2 = peek();
        if (iVar2 != 0x3d) {
          return 0x1c;
        }
        shiftChar();
        return 0x58;
      }
      if (iVar2 != 0x3d) {
        return 0x12;
      }
      shiftChar();
      return 0x14;
    case 0x3d:
      iVar2 = peek();
      if (iVar2 != 0x3d) {
        return 0x4e;
      }
      shiftChar();
      return 0x16;
    case 0x3e:
      iVar2 = peek();
      if (iVar2 == 0x3d) {
        shiftChar();
        return 0x13;
      }
      if (iVar2 != 0x3e) {
        return 0x11;
      }
      shiftChar();
      iVar2 = peek();
      if (iVar2 == 0x3d) {
        shiftChar();
        return 0x59;
      }
      if (iVar2 == 0x3e) {
        shiftChar();
        return 0x1e;
      }
      return 0x1d;
    case 0x40:
      yylval.expr.val._0_2_ = 0x40;
      return 0x4a;
    case 0x5b:
      return 9;
    case 0x5c:
      readLineContinuation();
      break;
    case 0x5d:
      return 10;
    case 0x5e:
      iVar2 = peek();
      if (iVar2 != 0x3d) {
        return 0x1a;
      }
      shiftChar();
      return 0x56;
    case 0x60:
      yylval.sectSpec.bank = readGfxConstant();
      return 3;
    case 0x7c:
      iVar2 = peek();
      if (iVar2 == 0x3d) {
        shiftChar();
        return 0x55;
      }
      if (iVar2 == 0x7c) {
        shiftChar();
        return 0x10;
      }
      return 0x19;
    case 0x7e:
      return 0x22;
    case -1:
      return 0;
    }
    lexerState->atLineStart = false;
  } while( true );
}

Assistant:

static int yylex_NORMAL(void)
{
	for (;;) {
		int c = nextChar();

		switch (c) {
		// Ignore whitespace and comments

		case ';':
			discardComment();
			// fallthrough
		case ' ':
		case '\t':
			break;

		// Handle unambiguous single-char tokens

		case '~':
			return T_OP_NOT;

		case '@':
			yylval.symName[0] = '@';
			yylval.symName[1] = '\0';
			return T_ID;

		case '[':
			return T_LBRACK;
		case ']':
			return T_RBRACK;
		case '(':
			return T_LPAREN;
		case ')':
			return T_RPAREN;
		case ',':
			return T_COMMA;

		// Handle ambiguous 1- or 2-char tokens

		case '+': // Either += or ADD
			if (peek() == '=') {
				shiftChar();
				return T_POP_ADDEQ;
			}
			return T_OP_ADD;

		case '-': // Either -= or SUB
			if (peek() == '=') {
				shiftChar();
				return T_POP_SUBEQ;
			}
			return T_OP_SUB;

		case '*': // Either *=, MUL, or EXP
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_MULEQ;
			case '*':
				shiftChar();
				return T_OP_EXP;
			default:
				return T_OP_MUL;
			}

		case '/': // Either /=, DIV, or a block comment
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_DIVEQ;
			case '*':
				shiftChar();
				discardBlockComment();
				break;
			default:
				return T_OP_DIV;
			}
			break;

		case '|': // Either |=, binary OR, or logical OR
			switch (peek()) {
			case '=':
				shiftChar();
				return T_POP_OREQ;
			case '|':
				shiftChar();
				return T_OP_LOGICOR;
			default:
				return T_OP_OR;
			}

		case '^': // Either ^= or XOR
			if (peek() == '=') {
				shiftChar();
				return T_POP_XOREQ;
			}
			return T_OP_XOR;

		case '=': // Either assignment or EQ
			if (peek() == '=') {
				shiftChar();
				return T_OP_LOGICEQU;
			}
			return T_POP_EQUAL;

		case '!': // Either a NEQ or negation
			if (peek() == '=') {
				shiftChar();
				return T_OP_LOGICNE;
			}
			return T_OP_LOGICNOT;

		// Handle ambiguous 1-, 2-, or 3-char tokens

		case '<': // Either <<=, LT, LTE, or left shift
			switch (peek()) {
			case '=':
				shiftChar();
				return T_OP_LOGICLE;
			case '<':
				shiftChar();
				if (peek() == '=') {
					shiftChar();
					return T_POP_SHLEQ;
				}
				return T_OP_SHL;
			default:
				return T_OP_LOGICLT;
			}

		case '>': // Either >>=, GT, GTE, or either kind of right shift
			switch (peek()) {
			case '=':
				shiftChar();
				return T_OP_LOGICGE;
			case '>':
				shiftChar();
				switch (peek()) {
				case '=':
					shiftChar();
					return T_POP_SHREQ;
				case '>':
					shiftChar();
					return T_OP_USHR;
				default:
					return T_OP_SHR;
				}
			default:
				return T_OP_LOGICGT;
			}

		case ':': // Either :, ::, or an anonymous label ref
			c = peek();
			switch (c) {
			case ':':
				shiftChar();
				return T_DOUBLE_COLON;
			case '+':
			case '-':
				readAnonLabelRef(c);
				return T_ANON;
			default:
				return T_COLON;
			}

		// Handle numbers

		case '0': // Decimal or fixed-point number
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9': {
			uint32_t n = readNumber(10, c - '0');

			if (peek() == '.') {
				shiftChar();
				n = readFractionalPart(n);
			}
			yylval.constValue = n;
			return T_NUMBER;
		}

		case '&': // Either &=, binary AND, logical AND, or an octal constant
			c = peek();
			if (c == '=') {
				shiftChar();
				return T_POP_ANDEQ;
			} else if (c == '&') {
				shiftChar();
				return T_OP_LOGICAND;
			} else if (c >= '0' && c <= '7') {
				yylval.constValue = readNumber(8, 0);
				return T_NUMBER;
			}
			return T_OP_AND;

		case '%': // Either %=, MOD, or a binary constant
			c = peek();
			if (c == '=') {
				shiftChar();
				return T_POP_MODEQ;
			} else if (c == binDigits[0] || c == binDigits[1]) {
				yylval.constValue = readBinaryNumber();
				return T_NUMBER;
			}
			return T_OP_MOD;

		case '$': // Hex constant
			yylval.constValue = readHexNumber();
			return T_NUMBER;

		case '`': // Gfx constant
			yylval.constValue = readGfxConstant();
			return T_NUMBER;

		// Handle strings

		case '"':
			readString(false);
			return T_STRING;

		// Handle newlines and EOF

		case '\r':
			handleCRLF(c);
			// fallthrough
		case '\n':
			return T_NEWLINE;

		case EOF:
			return T_EOF;

		// Handle line continuations

		case '\\':
			// Macro args were handled by `peek`, and character escapes do not exist
			// outside of string literals, so this must be a line continuation.
			readLineContinuation();
			break;

		// Handle raw strings... or fall through if '#' is not followed by '"'

		case '#':
			if (peek() == '"') {
				shiftChar();
				readString(true);
				return T_STRING;
			}
			// fallthrough

		// Handle identifiers... or report garbage characters

		default:
			if (startsIdentifier(c)) {
				int tokenType = readIdentifier(c);

				// An ELIF after a taken IF needs to not evaluate its condition
				if (tokenType == T_POP_ELIF && lexerState->lastToken == T_NEWLINE
				 && lexer_GetIFDepth() > 0 && lexer_RanIFBlock()
				 && !lexer_ReachedELSEBlock())
					return yylex_SKIP_TO_ENDC();

				// If a keyword, don't try to expand
				if (tokenType != T_ID && tokenType != T_LOCAL_ID)
					return tokenType;

				// Local symbols cannot be string expansions
				if (tokenType == T_ID && lexerState->expandStrings) {
					// Attempt string expansion
					struct Symbol const *sym = sym_FindExactSymbol(yylval.symName);

					if (sym && sym->type == SYM_EQUS) {
						char const *s = sym_GetStringValue(sym);

						assert(s);
						if (s[0])
							beginExpansion(s, false, sym->name);
						continue; // Restart, reading from the new buffer
					}
				}

				if (tokenType == T_ID && (lexerState->atLineStart || peek() == ':'))
					return T_LABEL;

				return tokenType;
			}

			// Do not report weird characters when capturing, it'll be done later
			if (!lexerState->capturing) {
				// TODO: try to group reportings
				error("Unknown character %s\n", printChar(c));
			}
		}
		lexerState->atLineStart = false;
	}
}